

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear(MessageGenerator *this,Printer *p)

{
  FieldGeneratorTable *this_00;
  pointer ppFVar1;
  anon_unknown_0 *this_01;
  pointer end;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint32_t n;
  ChunkIterator end_00;
  string *psVar8;
  char *pcVar9;
  FieldGenerator *pFVar10;
  value_type pOVar11;
  FieldChunk *pFVar12;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar13;
  long lVar14;
  int __c;
  FieldChunk *extraout_RDX;
  FieldChunk *extraout_RDX_00;
  FieldChunk *extraout_RDX_01;
  FieldChunk *extraout_RDX_02;
  FieldChunk *extraout_RDX_03;
  FieldChunk *extraout_RDX_04;
  FieldChunk *extraout_RDX_05;
  FieldChunk *extraout_RDX_06;
  FieldChunk *has_bit_indices;
  FieldChunk *extraout_RDX_07;
  FieldChunk *extraout_RDX_08;
  FieldChunk *extraout_RDX_09;
  FieldChunk *extraout_RDX_10;
  FieldChunk *extraout_RDX_11;
  FieldChunk *pFVar15;
  FieldChunk *extraout_RDX_12;
  FieldChunk *extraout_RDX_13;
  FieldChunk *extraout_RDX_14;
  FieldDescriptor **field;
  pointer ppFVar16;
  FieldDescriptor *pFVar17;
  pointer pFVar18;
  Options *pOVar19;
  FieldDescriptor *pFVar20;
  ChunkIterator start;
  undefined1 auVar21 [16];
  bool chunk_is_split;
  bool has_default_split_check;
  int cached_has_word_index;
  char local_1f9;
  MessageGenerator *local_1f8;
  Options *local_1f0;
  FieldChunk *local_1e8;
  anon_unknown_0 *local_1e0;
  int local_1d8;
  allocator<char> local_1d1;
  vector<int,_std::allocator<int>_> *local_1d0;
  Formatter format;
  uint local_18c;
  string chunk_mask_str;
  string local_168;
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  chunks;
  string local_118;
  FormatSpec<unsigned_int> local_f8;
  FieldDescriptor *field_1;
  Descriptor *local_e0;
  
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar2) {
    format.vars_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    format.vars_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    format.vars_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = (ctrl_t *)google::protobuf::internal::TypeCardToString_abi_cxx11_;
    format.printer_ = p;
    Formatter::operator()<>
              (&format,
               "PROTOBUF_NOINLINE void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
              );
    *(long *)(format.printer_ + 0x68) =
         *(long *)(format.printer_ + 0x68) + *(long *)(format.printer_ + 0x58);
    Formatter::operator()<>(&format,"$pbi$::TSanWrite(&_impl_);\n");
    Formatter::operator()<>
              (&format,
               "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
              );
    pFVar15 = extraout_RDX;
    if (0 < *(int *)(this->descriptor_ + 0x88)) {
      Formatter::operator()<>(&format,"$extensions$.Clear();\n");
      pFVar15 = extraout_RDX_00;
    }
    ppFVar16 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_1d8 = 0;
    local_1f8 = this;
    for (; ppFVar16 != ppFVar1; ppFVar16 = ppFVar16 + 1) {
      bVar2 = CanClearByZeroing(*ppFVar16);
      pFVar15 = extraout_RDX_01;
      if (bVar2) {
        iVar5 = EstimateAlignmentSize(*ppFVar16);
        local_1d8 = local_1d8 + iVar5;
        pFVar15 = extraout_RDX_02;
      }
    }
    chunks.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    chunks.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    chunks.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8 = (FieldChunk *)
                (local_1f8->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pFVar18 = (pointer)0x0;
    iVar5 = 0;
    local_1f0 = &this->options_;
    for (pFVar12 = (FieldChunk *)
                   (local_1f8->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        end = chunks.
              super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
              ._M_impl.super__Vector_impl_data._M_finish, pFVar12 != local_1e8;
        pFVar12 = (FieldChunk *)&pFVar12->fields) {
      pFVar17 = *(FieldDescriptor **)pFVar12;
      field_1 = pFVar17;
      iVar6 = iVar5;
      if (chunks.
          super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_start == pFVar18) {
LAB_001c6ef1:
        uVar4 = google::protobuf::internal::cpp::HasHasbit(pFVar17);
        pOVar19 = local_1f0;
        chunk_mask_str._M_dataplus._M_p._0_1_ = uVar4;
        bVar2 = IsRarelyPresent(field_1,local_1f0);
        local_168._M_dataplus._M_p._0_1_ = bVar2;
        bVar2 = ShouldSplit(field_1,pOVar19);
        local_118._M_dataplus._M_p._0_1_ = bVar2;
        std::
        vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>
        ::emplace_back<bool,bool,bool>
                  ((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>
                    *)&chunks,(bool *)&chunk_mask_str,(bool *)&local_168,(bool *)&local_118);
        pFVar18 = chunks.
                  super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pFVar20 = pFVar18[-1].fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1];
        iVar6 = HasByteIndex(local_1f8,pFVar20);
        iVar7 = HasByteIndex(local_1f8,pFVar17);
        if (iVar6 != iVar7) {
LAB_001c6ee3:
          pFVar17 = field_1;
          iVar6 = 0;
          goto LAB_001c6ef1;
        }
        bVar2 = FieldDescriptor::is_repeated(pFVar20);
        bVar3 = FieldDescriptor::is_repeated(pFVar17);
        if (bVar2 != bVar3) goto LAB_001c6ee3;
        bVar2 = IsLikelyPresent(pFVar20,local_1f0);
        bVar3 = IsLikelyPresent(pFVar17,local_1f0);
        if (bVar2 != bVar3) goto LAB_001c6ee3;
        bVar2 = ShouldSplit(pFVar20,local_1f0);
        bVar3 = ShouldSplit(pFVar17,local_1f0);
        if (bVar2 != bVar3) goto LAB_001c6ee3;
        bVar2 = CanClearByZeroing(pFVar20);
        local_1d0 = (vector<int,_std::allocator<int>_> *)CONCAT71(local_1d0._1_7_,bVar2);
        bVar2 = CanClearByZeroing(pFVar17);
        iVar6 = iVar5 + 1;
        if (((bool)(char)local_1d0 != bVar2) &&
           (bVar2 = CanClearByZeroing(pFVar20), !bVar2 || iVar5 != 0 && local_1d8 < 5))
        goto LAB_001c6ee3;
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back(&pFVar18[-1].fields,&field_1);
      pFVar15 = extraout_RDX_03;
      iVar5 = iVar6;
    }
    cached_has_word_index = -1;
    local_1d0 = &local_1f8->has_bit_indices_;
    this_00 = &local_1f8->field_generators_;
    pOVar19 = local_1f0;
    start._M_current =
         chunks.
         super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
         ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (start._M_current == end) break;
      end_00 = (anonymous_namespace)::
               FindNextUnequalChunk<bool(google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const&)>
                         (start,(ChunkIterator)end,pFVar15);
      local_1e8 = (FieldChunk *)CONCAT44(local_1e8._4_4_,cached_has_word_index);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&field_1,"",(allocator<char> *)&chunk_mask_str);
      local_1f9 = anon_unknown_0::MaybeEmitHaswordsCheck
                            (start,end_00,pOVar19,local_1d0,(int)local_1e8,(string *)&field_1,p);
      std::__cxx11::string::~string((string *)&field_1);
      pFVar15 = extraout_RDX_04;
      if (((start._M_current)->fields).
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          ((start._M_current)->fields).
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        has_default_split_check = false;
      }
      else {
        has_default_split_check = (start._M_current)->should_split;
        if (has_default_split_check == true) {
          Formatter::operator()<>(&format,"if (!IsSplitMessageDefault()) {\n");
          *(long *)(format.printer_ + 0x68) =
               *(long *)(format.printer_ + 0x68) + *(long *)(format.printer_ + 0x58);
          pFVar15 = extraout_RDX_05;
        }
      }
      while (start._M_current != end_00._M_current) {
        chunk_is_split = (start._M_current)->should_split;
        psVar8 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                           (&has_default_split_check,&chunk_is_split,
                            "has_default_split_check == chunk_is_split");
        if (psVar8 != (string *)0x0) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&field_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                     ,0xdb2,psVar8->_M_string_length,(psVar8->_M_dataplus)._M_p);
          goto LAB_001c76c5;
        }
        pvVar13 = &(start._M_current)->fields;
        ppFVar1 = ((start._M_current)->fields).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar2 = false;
        pFVar17 = (FieldDescriptor *)0x0;
        pFVar20 = (FieldDescriptor *)0x0;
        local_1e0 = (anon_unknown_0 *)pvVar13;
        for (ppFVar16 = ((start._M_current)->fields).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; this_01 = local_1e0,
            ppFVar16 != ppFVar1; ppFVar16 = ppFVar16 + 1) {
          bVar3 = CanClearByZeroing(*ppFVar16);
          if (bVar3) {
            if (bVar2) {
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&field_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                         ,0xdba,0x12,"!saw_non_zero_init");
              goto LAB_001c76c5;
            }
            pFVar17 = *ppFVar16;
            if (pFVar20 == (FieldDescriptor *)0x0) {
              pFVar20 = pFVar17;
            }
          }
          bVar2 = !bVar3;
        }
        iVar5 = HasBitIndex(local_1f8,(FieldDescriptor *)**(undefined8 **)local_1e0);
        pFVar15 = extraout_RDX_06;
        local_1e8 = start._M_current;
        if (iVar5 == -1) {
LAB_001c71c1:
          uVar4 = SUB81(pvVar13,0);
          local_1e0 = (anon_unknown_0 *)((ulong)local_1e0 & 0xffffffff00000000);
        }
        else {
          ppFVar16 = ((start._M_current)->fields).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          pvVar13 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)((long)ppFVar16 -
                       (long)((start._M_current)->fields).
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          pFVar15 = start._M_current;
          if (((pvVar13 < (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)0x9) ||
              (bVar2 = IsLikelyPresent(ppFVar16[-1],local_1f0), pFVar15 = has_bit_indices, bVar2))
             || ((pFVar17 ==
                  (local_1e8->fields).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1] && (local_1d8 < 5))))
          goto LAB_001c71c1;
          n = anon_unknown_0::GenChunkMask
                        (this_01,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  *)local_1d0,(vector<int,_std::allocator<int>_> *)has_bit_indices);
          local_118._M_dataplus._M_p = (pointer)(ulong)n;
          local_118._M_string_length._0_2_ = 0x3008;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          local_168.field_2._M_allocated_capacity = 0;
          local_168.field_2._8_8_ = 0;
          local_168._M_string_length = 0;
          _field_1 = absl::lts_20240722::strings_internal::
                     ExtractStringification<absl::lts_20240722::Hex>
                               ((StringifySink *)&local_168,(Hex *)&local_118);
          absl::lts_20240722::StrCat_abi_cxx11_
                    (&chunk_mask_str,(lts_20240722 *)&field_1,(AlphaNum *)field_1._8_8_);
          std::__cxx11::string::~string((string *)&local_168);
          iVar5 = anon_unknown_0::popcnt(n);
          psVar8 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                             (2,iVar5,"2 <= popcnt(chunk_mask)");
          if (psVar8 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&field_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                       ,0xdd5,psVar8->_M_string_length,(psVar8->_M_dataplus)._M_p);
            goto LAB_001c76c5;
          }
          psVar8 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_
                             (8,iVar5,"8 >= popcnt(chunk_mask)");
          iVar5 = cached_has_word_index;
          if (psVar8 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&field_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                       ,0xdd6,psVar8->_M_string_length,(psVar8->_M_dataplus)._M_p);
            goto LAB_001c76c5;
          }
          iVar6 = HasWordIndex(local_1f8,(FieldDescriptor *)**(undefined8 **)this_01);
          if (iVar5 != iVar6) {
            cached_has_word_index =
                 HasWordIndex(local_1f8,(FieldDescriptor *)**(undefined8 **)this_01);
            Formatter::operator()
                      (&format,"cached_has_bits = $has_bits$[$1$];\n",&cached_has_word_index);
          }
          Formatter::operator()(&format,"if (cached_has_bits & 0x$1$u) {\n",&chunk_mask_str);
          lVar14 = *(long *)(format.printer_ + 0x58);
          *(long *)(format.printer_ + 0x68) = *(long *)(format.printer_ + 0x68) + lVar14;
          auVar21 = std::__cxx11::string::~string((string *)&chunk_mask_str);
          pFVar15 = auVar21._8_8_;
          uVar4 = (undefined1)lVar14;
          local_1e0 = (anon_unknown_0 *)CONCAT44(local_1e0._4_4_,(int)CONCAT71(auVar21._1_7_,1));
        }
        if (pFVar20 != (FieldDescriptor *)0x0) {
          if (pFVar20 == pFVar17) {
            pFVar10 = FieldGeneratorTable::get(this_00,pFVar20);
            FieldGenerator::GenerateMessageClearingCode(pFVar10,p);
            pFVar15 = extraout_RDX_08;
          }
          else {
            bVar2 = ShouldSplit(pFVar20,local_1f0);
            field_1._0_1_ = bVar2;
            psVar8 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                               (&chunk_is_split,(bool *)&field_1,
                                "chunk_is_split == ShouldSplit(memset_start, options_)");
            if (psVar8 != (string *)0x0) {
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&field_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                         ,0xde5,psVar8->_M_string_length,(psVar8->_M_dataplus)._M_p);
LAB_001c76c5:
              absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&field_1);
            }
            bVar2 = ShouldSplit(pFVar17,local_1f0);
            field_1._0_1_ = bVar2;
            psVar8 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                               (&chunk_is_split,(bool *)&field_1,
                                "chunk_is_split == ShouldSplit(memset_end, options_)");
            if (psVar8 != (string *)0x0) {
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&field_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                         ,0xde6,psVar8->_M_string_length,(psVar8->_M_dataplus)._M_p);
              goto LAB_001c76c5;
            }
            FieldMemberName_abi_cxx11_
                      ((string *)&field_1,(cpp *)pFVar20,(FieldDescriptor *)(ulong)chunk_is_split,
                       (bool)uVar4);
            FieldMemberName_abi_cxx11_
                      (&chunk_mask_str,(cpp *)pFVar17,(FieldDescriptor *)(ulong)chunk_is_split,
                       (bool)uVar4);
            Formatter::operator()
                      (&format,
                       "::memset(&$1$, 0, static_cast<::size_t>(\n    reinterpret_cast<char*>(&$2$) -\n    reinterpret_cast<char*>(&$1$)) + sizeof($2$));\n"
                       ,(string *)&field_1,&chunk_mask_str);
            std::__cxx11::string::~string((string *)&chunk_mask_str);
            std::__cxx11::string::~string((string *)&field_1);
            pFVar15 = extraout_RDX_07;
          }
        }
        ppFVar1 = (local_1e8->fields).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppFVar16 = (local_1e8->fields).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppFVar16 != ppFVar1;
            ppFVar16 = ppFVar16 + 1) {
          bVar2 = CanClearByZeroing(*ppFVar16);
          pFVar15 = extraout_RDX_09;
          if (!bVar2) {
            iVar5 = HasBitIndex(local_1f8,*ppFVar16);
            pFVar17 = *ppFVar16;
            if ((iVar5 == -1) ||
               (1 < *(int *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar17[2] * 4
                            ) - 9U)) {
              bVar2 = false;
            }
            else {
              if (*(char *)(*(long *)(pFVar17 + 0x38) + 0x8c) == '\0') {
                pcVar9 = FieldDescriptor::index(pFVar17,(char *)pFVar17,__c);
                iVar5 = (local_1d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[(int)pcVar9];
                iVar6 = iVar5 / 0x20;
                if (cached_has_word_index != iVar6) {
                  cached_has_word_index = iVar6;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&chunk_mask_str,"index",(allocator<char> *)&local_168);
                  io::Printer::Sub::Sub<int&>
                            ((Sub *)&field_1,&chunk_mask_str,&cached_has_word_index);
                  google::protobuf::io::Printer::Emit
                            (p,(Sub *)&field_1,1,0x46,
                             "\n                cached_has_bits = $has_bits$[$index$];\n              "
                            );
                  io::Printer::Sub::~Sub((Sub *)&field_1);
                  std::__cxx11::string::~string((string *)&chunk_mask_str);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_168,"mask",&local_1d1);
                local_f8.super_type.spec_.data_ = "0x%08xu";
                local_f8.super_type.spec_.size_ = 7;
                local_18c = 1 << ((byte)iVar5 & 0x1f);
                absl::lts_20240722::StrFormat<unsigned_int>(&local_118,&local_f8,&local_18c);
                io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)&field_1,&local_168,&local_118);
                google::protobuf::io::Printer::Emit
                          (p,(Sub *)&field_1,1,0x3b,
                           "\n              if (cached_has_bits & $mask$) {\n            ");
                io::Printer::Sub::~Sub((Sub *)&field_1);
                std::__cxx11::string::~string((string *)&local_118);
                std::__cxx11::string::~string((string *)&local_168);
              }
              else {
                io::Printer::Emit(p,0x1f,"\n      if (has_$name$()) {\n    ");
              }
              *(long *)(format.printer_ + 0x68) =
                   *(long *)(format.printer_ + 0x68) + *(long *)(format.printer_ + 0x58);
              pFVar17 = *ppFVar16;
              bVar2 = true;
            }
            pFVar10 = FieldGeneratorTable::get(this_00,pFVar17);
            FieldGenerator::GenerateMessageClearingCode(pFVar10,p);
            pFVar15 = extraout_RDX_10;
            if (bVar2) {
              google::protobuf::io::Printer::Outdent();
              Formatter::operator()<>(&format,"}\n");
              pFVar15 = extraout_RDX_11;
            }
          }
        }
        if ((char)local_1e0 != '\0') {
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>(&format,"}\n");
          pFVar15 = extraout_RDX_12;
        }
        pOVar19 = local_1f0;
        start._M_current = local_1e8 + 1;
      }
      if (has_default_split_check == true) {
        google::protobuf::io::Printer::Outdent();
        Formatter::operator()<>(&format,"}\n");
        pFVar15 = extraout_RDX_13;
      }
      if (local_1f9 != '\0') {
        google::protobuf::io::Printer::Outdent();
        io::Printer::Emit(p,0x11,"\n        }\n      ");
        cached_has_word_index = -1;
        pFVar15 = extraout_RDX_14;
      }
    }
    chunk_mask_str._M_string_length = (size_type)local_1f8->descriptor_;
    field_1 = (FieldDescriptor *)(field_1._4_8_ << 0x20);
    local_e0 = (Descriptor *)chunk_mask_str._M_string_length;
    chunk_mask_str._M_dataplus._M_p._0_4_ = *(undefined4 *)(chunk_mask_str._M_string_length + 0x7c);
    while (bVar2 = cpp::operator!=((Iterator *)&field_1,(Iterator *)&chunk_mask_str), bVar2) {
      pOVar11 = OneOfRangeImpl::Iterator::operator*((Iterator *)&field_1);
      Formatter::operator()
                (&format,"clear_$1$();\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (pOVar11 + 8));
      field_1._0_4_ = (int)field_1 + 1;
    }
    if (local_1f8->num_weak_fields_ != 0) {
      Formatter::operator()<>(&format,"$weak_field_map$.ClearAll();\n");
    }
    if ((local_1f8->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (local_1f8->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Formatter::operator()<>(&format,"$has_bits$.Clear();\n");
    }
    Formatter::operator()<>(&format,"_internal_metadata_.Clear<$unknown_fields_type$>();\n");
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>(&format,"}\n");
    std::
    vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ::~vector(&chunks);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&format.vars_);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(p);

  // The maximum number of bytes we will memset to zero without checking their
  // hasbit to see if a zero-init is necessary.
  const int kMaxUnconditionalPrimitiveBytesClear = 4;

  format(
      "PROTOBUF_NOINLINE void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n");
  format.Indent();

  format("$pbi$::TSanWrite(&_impl_);\n");

  format(
      // TODO: It would be better to avoid emitting this if it is not used,
      // rather than emitting a workaround for the resulting warning.
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  if (descriptor_->extension_range_count() > 0) {
    format("$extensions$.Clear();\n");
  }

  // Collect fields into chunks. Each chunk may have an if() condition that
  // checks all hasbits in the chunk and skips it if none are set.
  int zero_init_bytes = 0;
  for (const auto& field : optimized_order_) {
    if (CanClearByZeroing(field)) {
      zero_init_bytes += EstimateAlignmentSize(field);
    }
  }
  bool merge_zero_init = zero_init_bytes > kMaxUnconditionalPrimitiveBytesClear;
  int chunk_count = 0;

  std::vector<FieldChunk> chunks = CollectFields(
      optimized_order_, options_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        chunk_count++;
        // This predicate guarantees that there is only a single zero-init
        // (memset) per chunk, and if present it will be at the beginning.
        bool same =
            HasByteIndex(a) == HasByteIndex(b) &&
            a->is_repeated() == b->is_repeated() &&
            IsLikelyPresent(a, options_) == IsLikelyPresent(b, options_) &&
            ShouldSplit(a, options_) == ShouldSplit(b, options_) &&
            (CanClearByZeroing(a) == CanClearByZeroing(b) ||
             (CanClearByZeroing(a) && (chunk_count == 1 || merge_zero_init)));
        if (!same) chunk_count = 0;
        return same;
      });

  auto it = chunks.begin();
  auto end = chunks.end();
  int cached_has_word_index = -1;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, MayGroupChunksForHaswordsCheck);
    bool has_haswords_check = MaybeEmitHaswordsCheck(
        it, next, options_, has_bit_indices_, cached_has_word_index, "", p);
    bool has_default_split_check = !it->fields.empty() && it->should_split;
    if (has_default_split_check) {
      // Some fields are cleared without checking has_bit. So we add the
      // condition here to avoid writing to the default split instance.
      format("if (!IsSplitMessageDefault()) {\n");
      format.Indent();
    }
    while (it != next) {
      const std::vector<const FieldDescriptor*>& fields = it->fields;
      bool chunk_is_split = it->should_split;
      ABSL_CHECK_EQ(has_default_split_check, chunk_is_split);

      const FieldDescriptor* memset_start = nullptr;
      const FieldDescriptor* memset_end = nullptr;
      bool saw_non_zero_init = false;

      for (const auto& field : fields) {
        if (CanClearByZeroing(field)) {
          ABSL_CHECK(!saw_non_zero_init);
          if (!memset_start) memset_start = field;
          memset_end = field;
        } else {
          saw_non_zero_init = true;
        }
      }

      // Whether we wrap this chunk in:
      //   if (cached_has_bits & <chunk hasbits) { /* chunk. */ }
      // We can omit the if() for chunk size 1, or if our fields do not have
      // hasbits. I don't understand the rationale for the last part of the
      // condition, but it matches the old logic.
      const bool check_has_byte =
          HasBitIndex(fields.front()) != kNoHasbit && fields.size() > 1 &&
          !IsLikelyPresent(fields.back(), options_) &&
          (memset_end != fields.back() || merge_zero_init);

      if (check_has_byte) {
        // Emit an if() that will let us skip the whole chunk if none are set.
        uint32_t chunk_mask = GenChunkMask(fields, has_bit_indices_);
        std::string chunk_mask_str =
            absl::StrCat(absl::Hex(chunk_mask, absl::kZeroPad8));

        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        ABSL_DCHECK_LE(2, popcnt(chunk_mask));
        ABSL_DCHECK_GE(8, popcnt(chunk_mask));

        if (cached_has_word_index != HasWordIndex(fields.front())) {
          cached_has_word_index = HasWordIndex(fields.front());
          format("cached_has_bits = $has_bits$[$1$];\n", cached_has_word_index);
        }
        format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
        format.Indent();
      }

      if (memset_start) {
        if (memset_start == memset_end) {
          // For clarity, do not memset a single field.
          field_generators_.get(memset_start).GenerateMessageClearingCode(p);
        } else {
          ABSL_CHECK_EQ(chunk_is_split, ShouldSplit(memset_start, options_));
          ABSL_CHECK_EQ(chunk_is_split, ShouldSplit(memset_end, options_));
          format(
              "::memset(&$1$, 0, static_cast<::size_t>(\n"
              "    reinterpret_cast<char*>(&$2$) -\n"
              "    reinterpret_cast<char*>(&$1$)) + sizeof($2$));\n",
              FieldMemberName(memset_start, chunk_is_split),
              FieldMemberName(memset_end, chunk_is_split));
        }
      }

      // Clear all non-zero-initializable fields in the chunk.
      for (const auto& field : fields) {
        if (CanClearByZeroing(field)) continue;
        // It's faster to just overwrite primitive types, but we should only
        // clear strings and messages if they were set.
        //
        // TODO:  Let the CppFieldGenerator decide this somehow.
        bool have_enclosing_if =
            HasBitIndex(field) != kNoHasbit &&
            (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
             field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);

        if (have_enclosing_if) {
          PrintPresenceCheck(field, has_bit_indices_, p,
                             &cached_has_word_index);
          format.Indent();
        }

        field_generators_.get(field).GenerateMessageClearingCode(p);

        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      }

      if (check_has_byte) {
        format.Outdent();
        format("}\n");
      }

      // To next chunk.
      ++it;
    }

    if (has_default_split_check) {
      format.Outdent();
      format("}\n");
    }
    if (has_haswords_check) {
      p->Outdent();
      p->Emit(R"cc(
        }
      )cc");

      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }
  // Step 4: Unions.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("clear_$1$();\n", oneof->name());
  }

  if (num_weak_fields_) {
    format("$weak_field_map$.ClearAll();\n");
  }

  // We don't clear donated status.

  if (!has_bit_indices_.empty()) {
    // Step 5: Everything else.
    format("$has_bits$.Clear();\n");
  }

  format("_internal_metadata_.Clear<$unknown_fields_type$>();\n");

  format.Outdent();
  format("}\n");
}